

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_NRM(Context *ctx)

{
  int iVar1;
  int iVar2;
  size_t in_RCX;
  size_t in_RDX;
  char src0 [64];
  char dst [64];
  char buf [64];
  char acStack_d8 [64];
  char local_98 [64];
  char local_58 [64];
  
  if ((ctx->profile_supports_nv4 == 0) &&
     ((ctx->profile_supports_nv2 == 0 || (ctx->shader_type != MOJOSHADER_TYPE_PIXEL)))) {
    make_ARB1_destarg_string(ctx,local_98,in_RDX);
    make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,acStack_d8,in_RCX);
    iVar1 = ctx->scratch_registers;
    iVar2 = iVar1 + 1;
    ctx->scratch_registers = iVar2;
    if (ctx->max_scratch_registers <= iVar1) {
      ctx->max_scratch_registers = iVar2;
    }
    snprintf(local_58,0x40,"scratch%d");
    output_line(ctx,"DP3 %s.w, %s, %s;",local_58,acStack_d8,acStack_d8);
    output_line(ctx,"RSQ %s.w, %s.w;",local_58,local_58);
    output_line(ctx,"MUL%s, %s.w, %s;",local_98,local_58,acStack_d8);
    emit_ARB1_dest_modifiers(ctx);
    return;
  }
  emit_ARB1_opcode_ds(ctx,"NRM");
  return;
}

Assistant:

EMIT_ARB1_OPCODE_DS_FUNC(ABS)

static void emit_ARB1_NRM(Context *ctx)
{
    // nv2 fragment programs (and anything nv4) have a real NRM.
    if ( (support_nv4(ctx)) || ((support_nv2(ctx)) && (shader_is_pixel(ctx))) )
        emit_ARB1_opcode_ds(ctx, "NRM");
    else
    {
        char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
        char buf[64]; allocate_ARB1_scratch_reg_name(ctx, buf, sizeof (buf));
        output_line(ctx, "DP3 %s.w, %s, %s;", buf, src0, src0);
        output_line(ctx, "RSQ %s.w, %s.w;", buf, buf);
        output_line(ctx, "MUL%s, %s.w, %s;", dst, buf, src0);
        emit_ARB1_dest_modifiers(ctx);
    } // else
}